

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkdir.cpp
# Opt level: O0

bool fs_mkdir(string_view path)

{
  string_view path_00;
  bool bVar1;
  string_view local_88;
  error_category *local_78;
  char *local_70;
  path local_58;
  undefined1 local_30 [8];
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  std::error_code::error_code((error_code *)local_30);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_58,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,auto_format);
  std::filesystem::create_directories(&local_58,(error_code *)local_30);
  std::filesystem::__cxx11::path::~path(&local_58);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_30);
  if (bVar1) {
    local_78 = ec._M_cat;
    local_70 = path._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"fs_mkdir");
    path_00._M_str = local_70;
    path_00._M_len = (size_t)local_78;
    fs_print_error(path_00,local_88,(error_code *)local_30);
  }
  path_local._M_str._7_1_ = !bVar1;
  return path_local._M_str._7_1_;
}

Assistant:

bool fs_mkdir(std::string_view path)
{
 // make directory with parents

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  // https://en.cppreference.com/w/cpp/filesystem/create_directory
  std::filesystem::create_directories(path, ec);
  // we don't use the return value as it indicates if a directory was created or not.
  if (!ec) FFS_LIKELY
    return true;
#else

if(path.empty())
  ec = std::make_error_code(std::errc::invalid_argument);
else {

  std::string buf;

  std::string const p = fs_resolve(path, false, false);
  // ERROR_PATH_NOT_FOUND if relative directory

  const std::vector<std::string> parts = fs_split(p);

  // if first part is root
  if(fs_slash_first(p))
    buf.push_back('/');

  // iterate over parts
  bool ok = false;

  for(const auto& p : parts){
    buf.append(p).push_back('/');
    if(fs_trace) std::cout << "TRACE:mkdir " << buf << "\n";
    // create directory
#ifdef _WIN32
    // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-createdirectorya
    ok = CreateDirectoryA(buf.data(), nullptr) != 0;
    if(!ok){
      const auto err = GetLastError();
      // ERROR_PATH_NOT_FOUND if relative directory, thus we absolute() before loop.
      // ERROR_ACCESS_DENIED is OK if it's not the last part
      ok = err == ERROR_ALREADY_EXISTS ||
            (err == ERROR_ACCESS_DENIED && p != parts.back());
    }
#else
  // https://www.man7.org/linux/man-pages/man2/mkdir.2.html
    ok = mkdir(buf.data(), S_IRWXU) == 0 ||
          errno == EEXIST ||
          (errno == EACCES && p != parts.back());
#endif

    if(!ok)  FFS_UNLIKELY
      break;
  } // for

  if(ok)  FFS_LIKELY
    return true;

} // if path.empty()

#endif

  fs_print_error(path, __func__, ec);
  return false;
}